

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  uint32_t hash_00;
  Handle *pHVar1;
  undefined8 in_RSI;
  Slice *in_RDI;
  LRUCache *unaff_retaddr;
  uint32_t hash;
  Slice *in_stack_ffffffffffffffe0;
  uint32_t hash_01;
  
  hash_01 = (uint32_t)((ulong)in_RSI >> 0x20);
  hash_00 = HashSlice(in_stack_ffffffffffffffe0);
  Shard(hash_00);
  pHVar1 = LRUCache::Lookup(unaff_retaddr,in_RDI,hash_01);
  return pHVar1;
}

Assistant:

Handle* Lookup(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Lookup(key, hash);
  }